

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.hpp
# Opt level: O0

position_type __thiscall
io::detail::memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>::
seek(memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long> *this,
    offset_type from,seek_mode mode)

{
  bool bVar1;
  position_type pVar2;
  system_error *this_00;
  error_code __ec;
  undefined1 auStack_38 [8];
  error_code ec;
  seek_mode mode_local;
  offset_type from_local;
  memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long> *this_local;
  position_type pos;
  
  ec._M_cat._4_4_ = mode;
  std::error_code::error_code((error_code *)auStack_38);
  pVar2 = seek(this,from,ec._M_cat._4_4_,(error_code *)auStack_38);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_38);
  if (!bVar1) {
    return (position_type)pVar2.pos_;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = (ulong)auStack_38 & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this_00,__ec);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

position_type seek(offset_type from, seek_mode mode)
    {
        std::error_code ec;
        auto pos = this->seek(from, mode, ec);
        if (ec) {
            throw std::system_error{ec};
        }
        return pos;
    }